

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_multi_var
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,size_t n)

{
  int iVar1;
  size_t sVar2;
  long in_RCX;
  long in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong in_stack_00000008;
  secp256k1_gej tmp;
  size_t offset;
  size_t nbp;
  size_t n_batch_points;
  size_t n_batches;
  _func_int_secp256k1_callback_ptr_secp256k1_scratch_ptr_secp256k1_gej_ptr_secp256k1_scalar_ptr_secp256k1_ecmult_multi_callback_ptr_void_ptr_size_t_size_t
  *f;
  size_t i;
  secp256k1_scalar *in_stack_00000708;
  secp256k1_scalar *in_stack_00000710;
  secp256k1_gej *in_stack_00000718;
  secp256k1_gej *in_stack_00000720;
  secp256k1_scratch *in_stack_fffffffffffffed8;
  secp256k1_callback *in_stack_fffffffffffffee0;
  long local_110;
  ulong local_f0;
  secp256k1_scratch *in_stack_ffffffffffffff18;
  secp256k1_callback *in_stack_ffffffffffffff20;
  ulong local_58;
  ulong local_50;
  code *local_48;
  ulong local_40;
  undefined8 local_38;
  undefined8 local_30;
  long local_28;
  long local_18;
  undefined8 local_10;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  secp256k1_gej_set_infinity((secp256k1_gej *)0x139d4c);
  if ((local_28 == 0) && (in_stack_00000008 == 0)) {
    local_4 = 1;
  }
  else if (in_stack_00000008 == 0) {
    secp256k1_ecmult(in_stack_00000720,in_stack_00000718,in_stack_00000710,in_stack_00000708);
    local_4 = 1;
  }
  else if (local_18 == 0) {
    local_4 = secp256k1_ecmult_multi_simple_var
                        ((secp256k1_gej *)tmp.y.n[2],(secp256k1_scalar *)tmp.y.n[1],
                         (secp256k1_ecmult_multi_callback *)tmp.y.n[0],(void *)tmp.x.n[4],tmp.x.n[3]
                        );
  }
  else {
    sVar2 = secp256k1_pippenger_max_points(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    iVar1 = secp256k1_ecmult_multi_batch_size_helper(&local_50,&local_58,sVar2,in_stack_00000008);
    if (iVar1 == 0) {
      local_4 = secp256k1_ecmult_multi_simple_var
                          ((secp256k1_gej *)tmp.y.n[2],(secp256k1_scalar *)tmp.y.n[1],
                           (secp256k1_ecmult_multi_callback *)tmp.y.n[0],(void *)tmp.x.n[4],
                           tmp.x.n[3]);
    }
    else {
      if (local_58 < 0x58) {
        sVar2 = secp256k1_strauss_max_points(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        iVar1 = secp256k1_ecmult_multi_batch_size_helper
                          (&local_50,&local_58,sVar2,in_stack_00000008);
        if (iVar1 == 0) {
          iVar1 = secp256k1_ecmult_multi_simple_var
                            ((secp256k1_gej *)tmp.y.n[2],(secp256k1_scalar *)tmp.y.n[1],
                             (secp256k1_ecmult_multi_callback *)tmp.y.n[0],(void *)tmp.x.n[4],
                             tmp.x.n[3]);
          return iVar1;
        }
        local_48 = secp256k1_ecmult_strauss_batch;
      }
      else {
        local_48 = secp256k1_ecmult_pippenger_batch;
      }
      for (local_40 = 0; local_40 < local_50; local_40 = local_40 + 1) {
        if (in_stack_00000008 < local_58) {
          local_f0 = in_stack_00000008;
        }
        else {
          local_f0 = local_58;
        }
        if (local_40 == 0) {
          local_110 = local_28;
        }
        else {
          local_110 = 0;
        }
        iVar1 = (*local_48)(local_10,local_18,&stack0xffffffffffffff18,local_110,local_30,local_38,
                            local_f0,local_58 * local_40);
        if (iVar1 == 0) {
          return 0;
        }
        secp256k1_gej_add_var
                  ((secp256k1_gej *)tmp.z.n[2],(secp256k1_gej *)tmp.z.n[1],
                   (secp256k1_gej *)tmp.z.n[0],(secp256k1_fe *)tmp.y.n[4]);
        in_stack_00000008 = in_stack_00000008 - local_f0;
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_ecmult_multi_var(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n) {
    size_t i;

    int (*f)(const secp256k1_callback* error_callback, secp256k1_scratch*, secp256k1_gej*, const secp256k1_scalar*, secp256k1_ecmult_multi_callback cb, void*, size_t, size_t);
    size_t n_batches;
    size_t n_batch_points;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n == 0) {
        return 1;
    } else if (n == 0) {
        secp256k1_ecmult(r, r, &secp256k1_scalar_zero, inp_g_sc);
        return 1;
    }
    if (scratch == NULL) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }

    /* Compute the batch sizes for Pippenger's algorithm given a scratch space. If it's greater than
     * a threshold use Pippenger's algorithm. Otherwise use Strauss' algorithm.
     * As a first step check if there's enough space for Pippenger's algo (which requires less space
     * than Strauss' algo) and if not, use the simple algorithm. */
    if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_pippenger_max_points(error_callback, scratch), n)) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }
    if (n_batch_points >= ECMULT_PIPPENGER_THRESHOLD) {
        f = secp256k1_ecmult_pippenger_batch;
    } else {
        if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_strauss_max_points(error_callback, scratch), n)) {
            return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
        }
        f = secp256k1_ecmult_strauss_batch;
    }
    for(i = 0; i < n_batches; i++) {
        size_t nbp = n < n_batch_points ? n : n_batch_points;
        size_t offset = n_batch_points*i;
        secp256k1_gej tmp;
        if (!f(error_callback, scratch, &tmp, i == 0 ? inp_g_sc : NULL, cb, cbdata, nbp, offset)) {
            return 0;
        }
        secp256k1_gej_add_var(r, r, &tmp, NULL);
        n -= nbp;
    }
    return 1;
}